

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O3

file_info * heap_get_entry(heap_queue *heap)

{
  uint uVar1;
  uint uVar2;
  file_info **ppfVar3;
  file_info *pfVar4;
  ulong uVar5;
  file_info *pfVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  
  uVar2 = heap->used;
  if ((int)uVar2 < 1) {
    return (file_info *)0x0;
  }
  ppfVar3 = heap->files;
  pfVar4 = *ppfVar3;
  uVar1 = uVar2 - 1;
  heap->used = uVar1;
  *ppfVar3 = ppfVar3[uVar1];
  if (2 < uVar2) {
    uVar5 = (*heap->files)->key;
    iVar11 = 0;
    iVar10 = 1;
    iVar8 = 0;
    do {
      ppfVar3 = heap->files;
      uVar7 = ppfVar3[iVar10]->key;
      iVar11 = iVar11 + 2;
      iVar9 = iVar10;
      if ((iVar11 < (int)uVar1) && (ppfVar3[iVar11]->key < uVar7)) {
        uVar7 = ppfVar3[iVar11]->key;
        iVar9 = iVar11;
      }
      if (uVar5 <= uVar7) {
        return pfVar4;
      }
      pfVar6 = ppfVar3[iVar8];
      ppfVar3[iVar8] = ppfVar3[iVar9];
      heap->files[iVar9] = pfVar6;
      iVar10 = iVar9 * 2 + 1;
      iVar11 = iVar9 * 2;
      iVar8 = iVar9;
    } while (iVar10 < (int)uVar1);
  }
  return pfVar4;
}

Assistant:

static struct file_info *
heap_get_entry(struct heap_queue *heap)
{
	uint64_t a_key, b_key, c_key;
	int a, b, c;
	struct file_info *r, *tmp;

	if (heap->used < 1)
		return (NULL);

	/*
	 * The first file in the list is the earliest; we'll return this.
	 */
	r = heap->files[0];

	/*
	 * Move the last item in the heap to the root of the tree
	 */
	heap->files[0] = heap->files[--(heap->used)];

	/*
	 * Rebalance the heap.
	 */
	a = 0; /* Starting element and its heap key */
	a_key = heap->files[a]->key;
	for (;;) {
		b = a + a + 1; /* First child */
		if (b >= heap->used)
			return (r);
		b_key = heap->files[b]->key;
		c = b + 1; /* Use second child if it is smaller. */
		if (c < heap->used) {
			c_key = heap->files[c]->key;
			if (c_key < b_key) {
				b = c;
				b_key = c_key;
			}
		}
		if (a_key <= b_key)
			return (r);
		tmp = heap->files[a];
		heap->files[a] = heap->files[b];
		heap->files[b] = tmp;
		a = b;
	}
}